

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

Status __thiscall
leveldb::DBImpl::RecoverLogFile
          (DBImpl *this,uint64_t log_number,bool last_log,bool *save_manifest,VersionEdit *edit,
          SequenceNumber *max_sequence)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _func_int **pp_Var2;
  undefined8 base;
  Compressor *bytes;
  bool bVar3;
  int iVar4;
  SequenceNumber SVar5;
  ulong uVar6;
  size_t sVar7;
  Writer *this_00;
  MemTable *this_01;
  undefined7 in_register_00000011;
  uint64_t number;
  ulong *in_stack_00000008;
  uint64_t lfile_size;
  SequentialFile *file;
  string fname;
  string scratch;
  WriteBatch batch;
  Slice record;
  LogReporter reporter;
  Reader reader;
  VersionEdit *local_190;
  undefined1 local_180 [64];
  Env *local_140;
  Slice local_138;
  uint64_t local_128;
  string local_120;
  string local_100;
  undefined1 local_e0 [40];
  Compressor *local_b8;
  Reporter local_b0;
  Compressor *local_a8;
  atomic<unsigned_long> local_a0;
  Comparator local_98;
  DBImpl *local_90;
  Reader local_88;
  
  number = CONCAT71(in_register_00000011,last_log);
  local_180._56_8_ = max_sequence;
  LogFileName(&local_120,(string *)(log_number + 0x898),number);
  (**(code **)(**(long **)(log_number + 8) + 0x10))
            (this,*(long **)(log_number + 8),&local_120,&local_140);
  if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
    local_180._36_4_ = SUB84(save_manifest,0);
    local_b0._vptr_Reporter = (_func_int **)&PTR__Reporter_00131240;
    local_a8 = *(Compressor **)(log_number + 8);
    local_a0.super___atomic_base<unsigned_long>._M_i =
         *(__atomic_base<unsigned_long> *)(log_number + 0x48);
    local_98._vptr_Comparator = (_func_int **)local_120._M_dataplus._M_p;
    local_90 = (DBImpl *)0x0;
    if (*(char *)(log_number + 0x3a) != '\0') {
      local_90 = this;
    }
    local_180._48_8_ = edit;
    log::Reader::Reader(&local_88,(SequentialFile *)local_140,&local_b0,true,0);
    local_128 = number;
    Log(*(Logger **)(log_number + 0x48),"Recovering log #%llu",number);
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    local_100._M_string_length = 0;
    local_100.field_2._M_local_buf[0] = '\0';
    local_e0._32_8_ = "";
    local_180._16_8_ = 0;
    local_b8 = (Compressor *)0x0;
    WriteBatch::WriteBatch((WriteBatch *)local_e0);
    local_180._40_8_ = log_number + 0x10;
    local_190 = (VersionEdit *)0x0;
    do {
      while( true ) {
        bVar3 = log::Reader::ReadRecord(&local_88,(Slice *)(local_e0 + 0x20),&local_100);
        bytes = local_b8;
        if ((!bVar3) || ((this->super_DB)._vptr_DB != (_func_int **)0x0)) goto LAB_0010ac86;
        if ((Compressor *)0xb < local_b8) break;
        local_180._0_8_ = "log record too small";
        local_180._8_8_ = (Env *)0x14;
        local_138.data_ = "";
        local_138.size_ = 0;
        Status::Status((Status *)(local_180 + 0x18),kCorruption,(Slice *)local_180,&local_138);
        RecoverLogFile(unsigned_long,bool,bool*,leveldb::VersionEdit*,unsigned_long*)::LogReporter::
        Corruption(unsigned_long,leveldb::Status_const__
                  (&local_b0,(size_t)bytes,(Status *)(local_180 + 0x18));
        if ((void *)local_180._24_8_ != (void *)0x0) {
          operator_delete__((void *)local_180._24_8_);
        }
      }
      WriteBatchInternal::SetContents((WriteBatch *)local_e0,(Slice *)(local_e0 + 0x20));
      if (local_190 == (VersionEdit *)0x0) {
        local_190 = (VersionEdit *)operator_new(0x70);
        MemTable::MemTable((MemTable *)local_190,(InternalKeyComparator *)local_180._40_8_);
        paVar1 = &(local_190->comparator_).field_2;
        *(int *)paVar1 = *(int *)paVar1 + 1;
      }
      WriteBatchInternal::InsertInto((WriteBatch *)local_180,(MemTable *)local_e0);
      pp_Var2 = (this->super_DB)._vptr_DB;
      (this->super_DB)._vptr_DB = (_func_int **)local_180._0_8_;
      local_180._0_8_ = pp_Var2;
      if (pp_Var2 != (_func_int **)0x0) {
        operator_delete__(pp_Var2);
      }
      MaybeIgnoreError((DBImpl *)log_number,(Status *)this);
      if ((this->super_DB)._vptr_DB != (_func_int **)0x0) break;
      SVar5 = WriteBatchInternal::Sequence((WriteBatch *)local_e0);
      iVar4 = WriteBatchInternal::Count((WriteBatch *)local_e0);
      uVar6 = ((long)iVar4 + SVar5) - 1;
      if (*in_stack_00000008 < uVar6) {
        *in_stack_00000008 = uVar6;
      }
      sVar7 = MemTable::ApproximateMemoryUsage((MemTable *)local_190);
      bVar3 = true;
      if (*(ulong *)(log_number + 0x50) < sVar7) {
        *(undefined1 *)&(((string *)local_180._48_8_)->_M_dataplus)._M_p = 1;
        WriteLevel0Table((DBImpl *)local_180,(MemTable *)log_number,local_190,
                         (Version *)local_180._56_8_);
        pp_Var2 = (this->super_DB)._vptr_DB;
        (this->super_DB)._vptr_DB = (_func_int **)local_180._0_8_;
        local_180._0_8_ = pp_Var2;
        if (pp_Var2 != (_func_int **)0x0) {
          operator_delete__(pp_Var2);
        }
        local_180._16_8_ = ZEXT48((int)local_180._16_8_ + 1);
        MemTable::Unref((MemTable *)local_190);
        bVar3 = (this->super_DB)._vptr_DB == (_func_int **)0x0;
        local_190 = (VersionEdit *)0x0;
      }
    } while (bVar3);
LAB_0010ac86:
    if (local_140 != (Env *)0x0) {
      (*local_140->_vptr_Env[1])();
    }
    base = local_180._56_8_;
    if (((this->super_DB)._vptr_DB == (_func_int **)0x0) &&
       (((byte)local_180._36_4_ & *(byte *)(log_number + 0x880) & local_180._16_4_ == 0) == 1)) {
      (**(code **)(**(long **)(log_number + 8) + 0x58))
                (&local_138,*(long **)(log_number + 8),&local_120,local_180);
      if ((Logger *)local_138.data_ == (Logger *)0x0) {
        (**(code **)(**(long **)(log_number + 8) + 0x28))
                  (local_180 + 0x18,*(long **)(log_number + 8),&local_120,log_number + 0x948);
        bVar3 = (void *)local_180._24_8_ == (void *)0x0;
        if ((void *)local_180._24_8_ != (void *)0x0) {
          operator_delete__((void *)local_180._24_8_);
        }
      }
      else {
        bVar3 = false;
      }
      if ((Logger *)local_138.data_ != (Logger *)0x0) {
        operator_delete__(local_138.data_);
      }
      if (bVar3) {
        Log(*(Logger **)(log_number + 0x48),"Reusing old log %s \n",local_120._M_dataplus._M_p);
        this_00 = (Writer *)operator_new(0x20);
        log::Writer::Writer(this_00,*(WritableFile **)(log_number + 0x948),local_180._0_8_);
        *(Writer **)(log_number + 0x958) = this_00;
        *(uint64_t *)(log_number + 0x950) = local_128;
        if (local_190 == (VersionEdit *)0x0) {
          this_01 = (MemTable *)operator_new(0x70);
          MemTable::MemTable(this_01,(InternalKeyComparator *)local_180._40_8_);
          *(MemTable **)(log_number + 0x930) = this_01;
          this_01->refs_ = this_01->refs_ + 1;
        }
        else {
          *(VersionEdit **)(log_number + 0x930) = local_190;
        }
        local_190 = (VersionEdit *)0x0;
      }
    }
    if (local_190 != (VersionEdit *)0x0) {
      if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
        *(undefined1 *)&(((string *)local_180._48_8_)->_M_dataplus)._M_p = 1;
        WriteLevel0Table((DBImpl *)local_180,(MemTable *)log_number,local_190,(Version *)base);
        pp_Var2 = (this->super_DB)._vptr_DB;
        (this->super_DB)._vptr_DB = (_func_int **)local_180._0_8_;
        local_180._0_8_ = pp_Var2;
        if (pp_Var2 != (_func_int **)0x0) {
          operator_delete__(pp_Var2);
        }
      }
      MemTable::Unref((MemTable *)local_190);
    }
    WriteBatch::~WriteBatch((WriteBatch *)local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                               local_100.field_2._M_local_buf[0]) + 1);
    }
    log::Reader::~Reader(&local_88);
    log::Reader::Reporter::~Reporter(&local_b0);
  }
  else {
    MaybeIgnoreError((DBImpl *)log_number,(Status *)this);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::RecoverLogFile(uint64_t log_number, bool last_log,
                              bool* save_manifest, VersionEdit* edit,
                              SequenceNumber* max_sequence) {
  struct LogReporter : public log::Reader::Reporter {
    Env* env;
    Logger* info_log;
    const char* fname;
    Status* status;  // null if options_.paranoid_checks==false
    void Corruption(size_t bytes, const Status& s) override {
      Log(info_log, "%s%s: dropping %d bytes; %s",
          (this->status == nullptr ? "(ignoring error) " : ""), fname,
          static_cast<int>(bytes), s.ToString().c_str());
      if (this->status != nullptr && this->status->ok()) *this->status = s;
    }
  };

  mutex_.AssertHeld();

  // Open the log file
  std::string fname = LogFileName(dbname_, log_number);
  SequentialFile* file;
  Status status = env_->NewSequentialFile(fname, &file);
  if (!status.ok()) {
    MaybeIgnoreError(&status);
    return status;
  }

  // Create the log reader.
  LogReporter reporter;
  reporter.env = env_;
  reporter.info_log = options_.info_log;
  reporter.fname = fname.c_str();
  reporter.status = (options_.paranoid_checks ? &status : nullptr);
  // We intentionally make log::Reader do checksumming even if
  // paranoid_checks==false so that corruptions cause entire commits
  // to be skipped instead of propagating bad information (like overly
  // large sequence numbers).
  log::Reader reader(file, &reporter, true /*checksum*/, 0 /*initial_offset*/);
  Log(options_.info_log, "Recovering log #%llu",
      (unsigned long long)log_number);

  // Read all the records and add to a memtable
  std::string scratch;
  Slice record;
  WriteBatch batch;
  int compactions = 0;
  MemTable* mem = nullptr;
  while (reader.ReadRecord(&record, &scratch) && status.ok()) {
    if (record.size() < 12) {
      reporter.Corruption(record.size(),
                          Status::Corruption("log record too small"));
      continue;
    }
    WriteBatchInternal::SetContents(&batch, record);

    if (mem == nullptr) {
      mem = new MemTable(internal_comparator_);
      mem->Ref();
    }
    status = WriteBatchInternal::InsertInto(&batch, mem);
    MaybeIgnoreError(&status);
    if (!status.ok()) {
      break;
    }
    const SequenceNumber last_seq = WriteBatchInternal::Sequence(&batch) +
                                    WriteBatchInternal::Count(&batch) - 1;
    if (last_seq > *max_sequence) {
      *max_sequence = last_seq;
    }

    if (mem->ApproximateMemoryUsage() > options_.write_buffer_size) {
      compactions++;
      *save_manifest = true;
      status = WriteLevel0Table(mem, edit, nullptr);
      mem->Unref();
      mem = nullptr;
      if (!status.ok()) {
        // Reflect errors immediately so that conditions like full
        // file-systems cause the DB::Open() to fail.
        break;
      }
    }
  }

  delete file;

  // See if we should keep reusing the last log file.
  if (status.ok() && options_.reuse_logs && last_log && compactions == 0) {
    assert(logfile_ == nullptr);
    assert(log_ == nullptr);
    assert(mem_ == nullptr);
    uint64_t lfile_size;
    if (env_->GetFileSize(fname, &lfile_size).ok() &&
        env_->NewAppendableFile(fname, &logfile_).ok()) {
      Log(options_.info_log, "Reusing old log %s \n", fname.c_str());
      log_ = new log::Writer(logfile_, lfile_size);
      logfile_number_ = log_number;
      if (mem != nullptr) {
        mem_ = mem;
        mem = nullptr;
      } else {
        // mem can be nullptr if lognum exists but was empty.
        mem_ = new MemTable(internal_comparator_);
        mem_->Ref();
      }
    }
  }

  if (mem != nullptr) {
    // mem did not get reused; compact it.
    if (status.ok()) {
      *save_manifest = true;
      status = WriteLevel0Table(mem, edit, nullptr);
    }
    mem->Unref();
  }

  return status;
}